

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int file_read_privatekey
              (LIBSSH2_SESSION *session,LIBSSH2_HOSTKEY_METHOD **hostkey_method,
              void **hostkey_abstract,uchar *method,size_t method_len,char *privkeyfile,
              char *passphrase)

{
  int iVar1;
  bool bVar2;
  LIBSSH2_HOSTKEY_METHOD **local_48;
  LIBSSH2_HOSTKEY_METHOD **hostkey_methods_avail;
  char *privkeyfile_local;
  size_t method_len_local;
  uchar *method_local;
  void **hostkey_abstract_local;
  LIBSSH2_HOSTKEY_METHOD **hostkey_method_local;
  LIBSSH2_SESSION *session_local;
  
  local_48 = libssh2_hostkey_methods();
  *hostkey_method = (LIBSSH2_HOSTKEY_METHOD *)0x0;
  *hostkey_abstract = (void *)0x0;
  while( true ) {
    bVar2 = false;
    if (*local_48 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
      bVar2 = (*local_48)->name != (char *)0x0;
    }
    if (!bVar2) goto LAB_001447a6;
    if (((*local_48)->initPEM !=
         (_func_int_LIBSSH2_SESSION_ptr_char_ptr_uchar_ptr_void_ptr_ptr *)0x0) &&
       (iVar1 = strncmp((*local_48)->name,(char *)method,method_len), iVar1 == 0)) break;
    local_48 = local_48 + 1;
  }
  *hostkey_method = *local_48;
LAB_001447a6:
  if (*hostkey_method == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    session_local._4_4_ = _libssh2_error(session,-0x11,"No handler for specified private key");
  }
  else {
    iVar1 = (*(*hostkey_method)->initPEM)(session,privkeyfile,(uchar *)passphrase,hostkey_abstract);
    if (iVar1 == 0) {
      session_local._4_4_ = 0;
    }
    else {
      session_local._4_4_ =
           _libssh2_error(session,-0x10,"Unable to initialize private key from file");
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
file_read_privatekey(LIBSSH2_SESSION * session,
                     const LIBSSH2_HOSTKEY_METHOD ** hostkey_method,
                     void **hostkey_abstract,
                     const unsigned char *method, size_t method_len,
                     const char *privkeyfile, const char *passphrase)
{
    const LIBSSH2_HOSTKEY_METHOD **hostkey_methods_avail =
        libssh2_hostkey_methods();

    _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                   "Loading private key file: %s", privkeyfile));
    *hostkey_method = NULL;
    *hostkey_abstract = NULL;
    while(*hostkey_methods_avail && (*hostkey_methods_avail)->name) {
        if((*hostkey_methods_avail)->initPEM
            && strncmp((*hostkey_methods_avail)->name, (const char *) method,
                       method_len) == 0) {
            *hostkey_method = *hostkey_methods_avail;
            break;
        }
        hostkey_methods_avail++;
    }
    if(!*hostkey_method) {
        return _libssh2_error(session, LIBSSH2_ERROR_METHOD_NONE,
                              "No handler for specified private key");
    }

    if((*hostkey_method)->
        initPEM(session, privkeyfile, (const unsigned char *) passphrase,
                hostkey_abstract)) {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Unable to initialize private key from file");
    }

    return 0;
}